

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O1

int agent_disconnect_unix(LIBSSH2_AGENT *agent)

{
  int iVar1;
  
  iVar1 = close(agent->fd);
  if (iVar1 != -1) {
    agent->fd = -1;
    return 0;
  }
  iVar1 = _libssh2_error(agent->session,-0xd,"failed closing the agent socket");
  return iVar1;
}

Assistant:

static int
agent_disconnect_unix(LIBSSH2_AGENT *agent)
{
    int ret;
    ret = close(agent->fd);
    if(ret != -1)
        agent->fd = LIBSSH2_INVALID_SOCKET;
    else
        return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_DISCONNECT,
                              "failed closing the agent socket");
    return LIBSSH2_ERROR_NONE;
}